

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testvidinfo.c
# Opt level: O3

int RunBlitTests(SDL_Surface *screen,SDL_Surface *bmp,int blitcount)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined2 local_40;
  undefined2 local_3e;
  undefined4 local_3c;
  ulong local_38;
  
  iVar6 = (screen->w - bmp->w) + 1;
  iVar7 = (screen->h - bmp->h) + 1;
  local_38 = 0;
  do {
    iVar5 = blitcount;
    if (0 < blitcount) {
      do {
        if (iVar6 == 0) {
          local_40 = 0;
        }
        else {
          iVar3 = rand();
          local_40 = (undefined2)(iVar3 % iVar6);
        }
        if (iVar7 == 0) {
          local_3e = 0;
        }
        else {
          iVar3 = rand();
          local_3e = (undefined2)(iVar3 % iVar7);
        }
        uVar1 = bmp->w;
        uVar2 = bmp->h;
        auVar8._4_4_ = uVar2;
        auVar8._0_4_ = uVar1;
        auVar8._8_8_ = 0;
        auVar8 = pshuflw(auVar8,auVar8,0xe8);
        local_3c = auVar8._0_4_;
        SDL_UpperBlit(bmp,0,screen,&local_40);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    SDL_Flip(screen);
    uVar4 = (int)local_38 + 1;
    local_38 = (ulong)uVar4;
  } while (uVar4 != 500);
  return 500;
}

Assistant:

int RunBlitTests(SDL_Surface *screen, SDL_Surface *bmp, int blitcount)
{
	int i, j;
	int maxx;
	int maxy;
	SDL_Rect dst;

	maxx = (int)screen->w - bmp->w + 1;
	maxy = (int)screen->h - bmp->h + 1;
	for ( i = 0; i < NUM_UPDATES; ++i ) {
		for ( j = 0; j < blitcount; ++j ) {
			if ( maxx ) {
				dst.x = rand() % maxx;
			} else {
				dst.x = 0;
			}
			if ( maxy ) {
				dst.y = rand() % maxy;
			} else {
				dst.y = 0;
			}
			dst.w = bmp->w;
			dst.h = bmp->h;
			SDL_BlitSurface(bmp, NULL, screen, &dst);
		}
		SDL_Flip(screen);
	}

	return i;
}